

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void close_state(lua_State *L)

{
  global_State *pgVar1;
  global_State *pgVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  pgVar1 = L->l_G;
  luaF_close(L,L->stack);
  pgVar2 = L->l_G;
  pgVar2->currentwhite = 'C';
  sweeplist(L,&pgVar2->rootgc,0xfffffffffffffffd);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < (pgVar2->strt).size; lVar4 = lVar4 + 1) {
    sweeplist(L,(GCObject **)((long)(pgVar2->strt).hash + lVar5),0xfffffffffffffffd);
    lVar5 = lVar5 + 8;
  }
  luaM_realloc_(L,(L->l_G->strt).hash,(long)(L->l_G->strt).size << 3,0);
  pcVar3 = (char *)luaM_realloc_(L,(pgVar1->buff).buffer,(pgVar1->buff).buffsize,0);
  (pgVar1->buff).buffer = pcVar3;
  (pgVar1->buff).buffsize = 0;
  freestack(L,L);
  (*pgVar1->frealloc)(pgVar1->ud,L,0x268,0);
  return;
}

Assistant:

static void close_state(lua_State*L){
global_State*g=G(L);
luaF_close(L,L->stack);
luaC_freeall(L);
luaM_freearray(L,G(L)->strt.hash,G(L)->strt.size,TString*);
luaZ_freebuffer(L,&g->buff);
freestack(L,L);
(*g->frealloc)(g->ud,fromstate(L),state_size(LG),0);
}